

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::handleProtectLicense
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  PragmaExpressionSyntax *expr;
  ParenPragmaExpressionSyntax *pPVar1;
  SyntaxNode *pSVar2;
  NameValuePragmaExpressionSyntax *pNVar3;
  Diagnostic *pDVar4;
  SimplePragmaExpressionSyntax *pSVar5;
  int *piVar6;
  ulong uVar7;
  size_type __rlen;
  size_t index;
  string_view sVar8;
  SourceRange SVar9;
  string_view arg;
  Token local_40;
  
  local_40.info = keyword.info;
  local_40._0_8_ = keyword._0_8_;
  if (args == (PragmaExpressionSyntax *)0x0) {
    SVar9 = Token::range(&local_40);
  }
  else {
    if (((args->super_SyntaxNode).kind == ParenPragmaExpression) &&
       (pPVar1 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                           (&args->super_SyntaxNode), (pPVar1->values).elements.size_ != 0)) {
      pPVar1 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                         (&args->super_SyntaxNode);
      uVar7 = (pPVar1->values).elements.size_ + 1;
      if (uVar7 < 2) {
        return;
      }
      index = 0;
      do {
        pSVar2 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                  operator[](&pPVar1->values,index)->super_SyntaxNode;
        if (pSVar2->kind != NameValuePragmaExpression) {
          SVar9 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
          pDVar4 = addDiag(this,(DiagCode)0x270004,SVar9);
          sVar8 = Token::valueText(&local_40);
          goto LAB_001a1fbc;
        }
        pNVar3 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                           (pSVar2);
        sVar8 = Token::valueText(&pNVar3->name);
        piVar6 = (int *)sVar8._M_str;
        switch(sVar8._M_len) {
        case 0:
          goto switchD_001a1e64_caseD_0;
        case 4:
          if (*piVar6 == 0x74697865) {
LAB_001a1f68:
            pSVar2 = &((pNVar3->value).ptr)->super_SyntaxNode;
            if (pSVar2 == (SyntaxNode *)0x0) {
LAB_001a201f:
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x26,
                         "T slang::not_null<slang::syntax::PragmaExpressionSyntax *>::get() const [T = slang::syntax::PragmaExpressionSyntax *]"
                        );
            }
            if (pSVar2->kind == SimplePragmaExpression) {
              pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                                 (pSVar2);
              if ((pSVar5->value).kind == StringLiteral) goto switchD_001a1e64_caseD_0;
              pSVar2 = &((pNVar3->value).ptr)->super_SyntaxNode;
              if (pSVar2 == (SyntaxNode *)0x0) goto LAB_001a201f;
            }
            SVar9 = slang::syntax::SyntaxNode::sourceRange(pSVar2);
            pDVar4 = addDiag(this,(DiagCode)0x1f0004,SVar9);
            goto LAB_001a1fbc;
          }
          break;
        case 5:
          if ((char)piVar6[1] == 'y' && *piVar6 == 0x72746e65) goto LAB_001a1f68;
          if ((char)piVar6[1] != 'h' || *piVar6 != 0x6374616d) break;
          expr = (pNVar3->value).ptr;
          if (expr == (PragmaExpressionSyntax *)0x0) goto LAB_001a201f;
          requireUInt32(this,expr);
          goto switchD_001a1e64_caseD_0;
        case 7:
          if ((*(int *)((long)piVar6 + 3) == 0x79726172 && *piVar6 == 0x7262696c) ||
             (*(int *)((long)piVar6 + 3) == 0x65727574 && *piVar6 == 0x74616566)) goto LAB_001a1f68;
        }
        SVar9 = Token::range(&pNVar3->name);
        pDVar4 = addDiag(this,(DiagCode)0x2e0004,SVar9);
        arg = Token::valueText(&local_40);
        pDVar4 = Diagnostic::operator<<(pDVar4,arg);
LAB_001a1fbc:
        Diagnostic::operator<<(pDVar4,sVar8);
switchD_001a1e64_caseD_0:
        index = index + 1;
        if (uVar7 >> 1 == index) {
          return;
        }
      } while( true );
    }
    SVar9 = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  pDVar4 = addDiag(this,(DiagCode)0x270004,SVar9);
  sVar8 = Token::valueText(&local_40);
  Diagnostic::operator<<(pDVar4,sVar8);
  return;
}

Assistant:

void Preprocessor::handleProtectLicense(Token keyword, const PragmaExpressionSyntax* args,
                                        SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "library"sv || name == "entry"sv || name == "feature"sv || name == "exit"sv) {
            if (nvp.value->kind != SyntaxKind::SimplePragmaExpression ||
                nvp.value->as<SimplePragmaExpressionSyntax>().value.kind !=
                    TokenKind::StringLiteral) {
                addDiag(diag::ExpectedProtectArg, nvp.value->sourceRange()) << name;
            }
        }
        else if (name == "match"sv) {
            requireUInt32(*nvp.value);
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}